

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerReflection::emit_specialization_constants(CompilerReflection *this)

{
  uint32_t uVar1;
  Stream *pSVar2;
  SPIRConstant *pSVar3;
  SPIRType *pSVar4;
  string *value;
  char *s;
  SpecializationConstant *pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  SPIRType type;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> specialization_constants;
  string local_228;
  SPIRConstant *local_208;
  SpecializationConstant *local_200;
  string local_1f8;
  undefined1 local_1d8 [32];
  uint *local_1b8;
  size_t local_1b0;
  uint local_1a0 [8];
  bool *local_180;
  size_t local_178;
  bool local_168 [24];
  TypedID<(spirv_cross::Types)1> *local_150;
  size_t local_148;
  TypedID<(spirv_cross::Types)1> local_138 [8];
  uint *local_118;
  size_t local_110;
  uint local_100 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_c0;
  undefined1 local_88 [88];
  
  Compiler::get_specialization_constants
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_88,(Compiler *)this);
  if (local_88._8_8_ != 0) {
    pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"specialization_constants","");
    simple_json::Stream::emit_json_key_array(pSVar2,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if (local_88._8_8_ != 0) {
      local_200 = (SpecializationConstant *)(local_88._0_8_ + local_88._8_8_ * 8);
      pSVar5 = (SpecializationConstant *)local_88._0_8_;
      do {
        paVar6 = &local_228.field_2;
        pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + (pSVar5->id).id);
        pSVar4 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar3->super_IVariant).field_0xc);
        SPIRType::SPIRType((SPIRType *)local_1d8,pSVar4);
        simple_json::Stream::begin_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pSVar2 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_228._M_dataplus._M_p = (pointer)paVar6;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"name","");
        local_208 = pSVar3;
        value = Compiler::get_name_abi_cxx11_((Compiler *)this,(ID)(pSVar5->id).id);
        simple_json::Stream::emit_json_key_value(pSVar2,&local_228,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar6) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        pSVar2 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_228._M_dataplus._M_p = (pointer)paVar6;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"id","");
        uVar1 = pSVar5->constant_id;
        simple_json::Stream::emit_json_key(pSVar2,&local_228);
        StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar1);
        paVar6 = &local_228.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar6) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        pSVar2 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_228._M_dataplus._M_p = (pointer)paVar6;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"type","");
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_1f8,this,local_1d8,0);
        simple_json::Stream::emit_json_key_value(pSVar2,&local_228,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1f8._M_dataplus._M_p._4_4_,(uint32_t)local_1f8._M_dataplus._M_p) !=
            &local_1f8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1f8._M_dataplus._M_p._4_4_,
                                   (uint32_t)local_1f8._M_dataplus._M_p));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar6) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        pSVar2 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_228._M_dataplus._M_p = (pointer)paVar6;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"variable_id","");
        uVar1 = (pSVar5->id).id;
        simple_json::Stream::emit_json_key(pSVar2,&local_228);
        StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar1);
        paVar6 = &local_228.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar6) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((int)local_1d8._12_4_ < 8) {
          if (local_1d8._12_4_ == 2) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_228._M_dataplus._M_p = (pointer)paVar6;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"default_value","");
            uVar1 = (local_208->m).c[0].r[0].u32;
            simple_json::Stream::emit_json_key(pSVar2,&local_228);
            bVar7 = uVar1 == 0;
            s = "true";
            if (bVar7) {
              s = "false";
            }
            StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,s,(ulong)bVar7 | 4);
LAB_0023ffdb:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
          }
          else if (local_1d8._12_4_ == 7) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_228._M_dataplus._M_p = (pointer)paVar6;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"default_value","");
            local_1f8._M_dataplus._M_p._0_4_ = (local_208->m).c[0].r[0].u32;
            simple_json::Stream::emit_json_key(pSVar2,&local_228);
            StringStream<4096UL,_4096UL>::operator<<<int,_0>(&pSVar2->buffer,(int *)&local_1f8);
LAB_0023ff19:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar6) {
              operator_delete(local_228._M_dataplus._M_p);
            }
          }
        }
        else {
          if (local_1d8._12_4_ == 8) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_228._M_dataplus._M_p = (pointer)paVar6;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"default_value","");
            uVar1 = (local_208->m).c[0].r[0].u32;
            simple_json::Stream::emit_json_key(pSVar2,&local_228);
            StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar1);
            goto LAB_0023ffdb;
          }
          if (local_1d8._12_4_ == 0xd) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_228._M_dataplus._M_p = (pointer)paVar6;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"default_value","");
            simple_json::Stream::emit_json_key_value(pSVar2,&local_228,(local_208->m).c[0].r[0].f32)
            ;
            goto LAB_0023ff19;
          }
        }
        simple_json::Stream::end_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_1d8._0_8_ = &PTR__SPIRType_003574a8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_c0);
        local_110 = 0;
        if (local_118 != local_100) {
          free(local_118);
        }
        local_148 = 0;
        if (local_150 != (TypedID<(spirv_cross::Types)1> *)(local_1d8 + 0xa0)) {
          free(local_150);
        }
        local_178 = 0;
        if (local_180 != (bool *)(local_1d8 + 0x70)) {
          free(local_180);
        }
        local_1b0 = 0;
        if (local_1b8 != (uint *)(local_1d8 + 0x38)) {
          free(local_1b8);
        }
        pSVar5 = pSVar5 + 1;
      } while (pSVar5 != local_200);
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  local_88._8_8_ = 0;
  if ((SpecializationConstant *)local_88._0_8_ != (SpecializationConstant *)(local_88 + 0x18)) {
    free((void *)local_88._0_8_);
  }
  return;
}

Assistant:

void CompilerReflection::emit_specialization_constants()
{
	auto specialization_constants = get_specialization_constants();
	if (specialization_constants.empty())
		return;

	json_stream->emit_json_key_array("specialization_constants");
	for (const auto &spec_const : specialization_constants)
	{
		auto &c = get<SPIRConstant>(spec_const.id);
		auto type = get<SPIRType>(c.constant_type);
		json_stream->begin_json_object();
		json_stream->emit_json_key_value("name", get_name(spec_const.id));
		json_stream->emit_json_key_value("id", spec_const.constant_id);
		json_stream->emit_json_key_value("type", type_to_glsl(type));
		json_stream->emit_json_key_value("variable_id", spec_const.id);
		switch (type.basetype)
		{
		case SPIRType::UInt:
			json_stream->emit_json_key_value("default_value", c.scalar());
			break;

		case SPIRType::Int:
			json_stream->emit_json_key_value("default_value", c.scalar_i32());
			break;

		case SPIRType::Float:
			json_stream->emit_json_key_value("default_value", c.scalar_f32());
			break;

		case SPIRType::Boolean:
			json_stream->emit_json_key_value("default_value", c.scalar() != 0);
			break;

		default:
			break;
		}
		json_stream->end_json_object();
	}
	json_stream->end_json_array();
}